

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GeneralMatrixMatrix.h
# Opt level: O2

void Eigen::internal::
     generic_product_impl<Eigen::Transpose<Eigen::Matrix<double,-1,-1,0,-1,-1>>,Eigen::Transpose<Eigen::Matrix<double,-1,-1,0,-1,-1>>,Eigen::DenseShape,Eigen::DenseShape,8>
     ::evalTo<Eigen::Matrix<double,_1,_1,0,_1,_1>>
               (Matrix<double,__1,__1,_0,__1,__1> *dst,
               Transpose<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *lhs,
               Transpose<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *rhs)

{
  long lVar1;
  Scalar local_20;
  
  lVar1 = (rhs->m_matrix->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).
          m_storage.m_cols;
  if ((0 < lVar1) &&
     (lVar1 + (dst->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.
              m_rows +
      (dst->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.m_cols <
      0x14)) {
    generic_product_impl<Eigen::Transpose<Eigen::Matrix<double,-1,-1,0,-1,-1>>,Eigen::Transpose<Eigen::Matrix<double,-1,-1,0,-1,-1>>,Eigen::DenseShape,Eigen::DenseShape,3>
    ::evalTo<Eigen::Matrix<double,_1,_1,0,_1,_1>>(dst,lhs,rhs);
    return;
  }
  DenseBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::setZero
            ((DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)dst);
  local_20 = 1.0;
  scaleAndAddTo<Eigen::Matrix<double,_1,_1,0,_1,_1>>(dst,lhs,rhs,&local_20);
  return;
}

Assistant:

static void evalTo(Dst& dst, const Lhs& lhs, const Rhs& rhs)
  {
    if((rhs.rows()+dst.rows()+dst.cols())<20 && rhs.rows()>0)
      lazyproduct::evalTo(dst, lhs, rhs);
    else
    {
      dst.setZero();
      scaleAndAddTo(dst, lhs, rhs, Scalar(1));
    }
  }